

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkFlattenLogicHierarchy2(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  int iVar4;
  Abc_Ntk_t *pNtkNew;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Abc_Des_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  int Counter;
  uint local_2c;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0xc0,"Abc_Ntk_t *Abc_NtkFlattenLogicHierarchy2(Abc_Ntk_t *)");
  }
  pNtkNew = Abc_NtkAlloc(ABC_NTK_NETLIST,pNtk->ntkFunc,1);
  pcVar7 = pNtk->pName;
  if (pcVar7 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar7);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar7);
  }
  pNtkNew->pName = pcVar6;
  pcVar7 = pNtk->pSpec;
  if (pcVar7 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar7);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar7);
  }
  pNtkNew->pSpec = pcVar6;
  Abc_NtkCleanCopy(pNtk);
  pVVar10 = pNtk->vPis;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar10->pArray[lVar11];
      Abc_NtkDupObj(pNtkNew,pAVar1,0);
      pAVar2 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanouts).pArray];
      pcVar7 = Abc_ObjName(pAVar2);
      pAVar8 = Abc_NtkFindOrCreateNet(pNtkNew,pcVar7);
      (pAVar2->field_6).pCopy = pAVar8;
      Abc_ObjAddFanin(pAVar8,(pAVar1->field_6).pCopy);
      lVar11 = lVar11 + 1;
      pVVar10 = pNtk->vPis;
    } while (lVar11 < pVVar10->nSize);
  }
  pVVar10 = pNtk->vPos;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar10->pArray[lVar11];
      Abc_NtkDupObj(pNtkNew,pAVar1,0);
      pAVar2 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
      pcVar7 = Abc_ObjName(pAVar2);
      pAVar8 = Abc_NtkFindOrCreateNet(pNtkNew,pcVar7);
      (pAVar2->field_6).pCopy = pAVar8;
      Abc_ObjAddFanin((pAVar1->field_6).pCopy,pAVar8);
      lVar11 = lVar11 + 1;
      pVVar10 = pNtk->vPos;
    } while (lVar11 < pVVar10->nSize);
  }
  local_2c = 0xffffffff;
  Abc_NtkFlattenLogicHierarchy2_rec(pNtkNew,pNtk,(int *)&local_2c);
  printf("Hierarchy reader flattened %d instances of logic boxes and left %d black boxes.\n",
         (ulong)local_2c,(ulong)(uint)pNtkNew->nObjCounts[10]);
  pAVar9 = pNtk->pDesign;
  if (pAVar9 != (Abc_Des_t *)0x0) {
    if (pAVar9->vTops->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((Abc_Ntk_t *)*pAVar9->vTops->pArray != pNtk) {
      __assert_fail("Vec_PtrEntry(pNtk->pDesign->vTops, 0) == pNtk",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                    ,0xe3,"Abc_Ntk_t *Abc_NtkFlattenLogicHierarchy2(Abc_Ntk_t *)");
    }
    pAVar9 = Abc_DesDupBlackboxes(pAVar9,pNtkNew);
    pNtkNew->pDesign = pAVar9;
    pVVar10 = pNtkNew->vBoxes;
    if (0 < pVVar10->nSize) {
      lVar11 = 0;
      do {
        pvVar3 = pVVar10->pArray[lVar11];
        if ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 10) {
          *(undefined8 *)((long)pvVar3 + 0x38) =
               *(undefined8 *)(*(long *)((long)pvVar3 + 0x38) + 0x160);
          pVVar10 = pNtkNew->vBoxes;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar10->nSize);
    }
  }
  Abc_NtkOrderCisCos(pNtkNew);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    puts("EXDC is not transformed.");
  }
  iVar4 = Abc_NtkCheck(pNtkNew);
  if (iVar4 == 0) {
    fwrite("Abc_NtkFlattenLogicHierarchy2(): Network check has failed.\n",0x3b,1,_stdout);
    Abc_NtkDelete(pNtkNew);
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkFlattenLogicHierarchy2( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pTerm, * pNet;
    int i, Counter;
    extern Abc_Des_t * Abc_DesDupBlackboxes( Abc_Des_t * p, Abc_Ntk_t * pNtkSave );

    assert( Abc_NtkIsNetlist(pNtk) );
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Abc_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Abc_UtilStrsav(pNtk->pSpec);

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // duplicate PIs/POs and their nets
    Abc_NtkForEachPi( pNtk, pTerm, i )
    {
        Abc_NtkDupObj( pNtkNew, pTerm, 0 );
        pNet = Abc_ObjFanout0( pTerm );
        pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNet) );
        Abc_ObjAddFanin( pNet->pCopy, pTerm->pCopy );
    }
    Abc_NtkForEachPo( pNtk, pTerm, i )
    {
        Abc_NtkDupObj( pNtkNew, pTerm, 0 );
        pNet = Abc_ObjFanin0( pTerm );
        pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNet) );
        Abc_ObjAddFanin( pTerm->pCopy, pNet->pCopy );
    }

    // recursively flatten hierarchy, create internal logic, add new PI/PO names if there are black boxes
    Counter = -1;
    Abc_NtkFlattenLogicHierarchy2_rec( pNtkNew, pNtk, &Counter );
    printf( "Hierarchy reader flattened %d instances of logic boxes and left %d black boxes.\n", 
        Counter, Abc_NtkBlackboxNum(pNtkNew) );

    if ( pNtk->pDesign )
    {
        // pass on the design
        assert( Vec_PtrEntry(pNtk->pDesign->vTops, 0) == pNtk );
        pNtkNew->pDesign = Abc_DesDupBlackboxes( pNtk->pDesign, pNtkNew );
        // update the pointers
        Abc_NtkForEachBlackbox( pNtkNew, pTerm, i )
            pTerm->pData = ((Abc_Ntk_t *)pTerm->pData)->pCopy;
    }

    // we may have added property outputs
    Abc_NtkOrderCisCos( pNtkNew );

    // copy the timing information
//    Abc_ManTimeDup( pNtk, pNtkNew );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        printf( "EXDC is not transformed.\n" );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkFlattenLogicHierarchy2(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}